

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O1

void __thiscall binlog::EventStream::readClockSync(EventStream *this,Range range)

{
  ClockSync clockSync;
  undefined1 auStack_68 [32];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  Range local_28;
  
  local_28._end = range._end;
  local_28._begin = range._begin;
  auStack_68._16_4_ = 0;
  auStack_68._20_8_ = 0;
  auStack_68._0_8_ = 0;
  auStack_68._8_4_ = 0;
  auStack_68._12_4_ = 0;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_48._M_p = (pointer)&local_38;
  mserialize::
  StructDeserializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
  ::deserialize<binlog::Range>((ClockSync *)auStack_68,&local_28);
  *(ulong *)((long)&(this->_clockSync).clockFrequency + 4) =
       CONCAT44(auStack_68._16_4_,auStack_68._12_4_);
  *(undefined8 *)((long)&(this->_clockSync).nsSinceEpoch + 4) = auStack_68._20_8_;
  (this->_clockSync).clockValue = auStack_68._0_8_;
  (this->_clockSync).clockFrequency = CONCAT44(auStack_68._12_4_,auStack_68._8_4_);
  std::__cxx11::string::operator=((string *)&(this->_clockSync).tzName,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,
                    CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EventStream::readClockSync(Range range)
{
  // Make sure _clockSync is updated only if deserialize does not throw
  ClockSync clockSync;
  mserialize::deserialize(clockSync, range);
  _clockSync = std::move(clockSync);
}